

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

void __thiscall
t_haxe_generator::generate_serialize_map_element
          (t_haxe_generator *this,ostream *out,t_map *tmap,string *iter,string *map)

{
  t_type *ptVar1;
  t_field vfield;
  t_field kfield;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0;
  t_field local_190;
  t_field local_e0;
  
  ptVar1 = tmap->key_type_;
  std::__cxx11::string::string((string *)&local_1b0,(string *)iter);
  t_field::t_field(&local_e0,ptVar1,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string((string *)&local_1d0,"",(allocator *)&local_190);
  generate_serialize_field(this,out,&local_e0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  ptVar1 = tmap->val_type_;
  std::operator+(&local_210,map,".get(");
  std::operator+(&local_250,&local_210,iter);
  std::operator+(&local_1f0,&local_250,")");
  t_field::t_field(&local_190,ptVar1,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"",(allocator *)&local_250);
  generate_serialize_field(this,out,&local_190,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  t_field::~t_field(&local_190);
  t_field::~t_field(&local_e0);
  return;
}

Assistant:

void t_haxe_generator::generate_serialize_map_element(ostream& out,
                                                      t_map* tmap,
                                                      string iter,
                                                      string map) {
  t_field kfield(tmap->get_key_type(), iter);
  generate_serialize_field(out, &kfield, "");
  t_field vfield(tmap->get_val_type(), map + ".get(" + iter + ")");
  generate_serialize_field(out, &vfield, "");
}